

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,Terminator *term,void *data)

{
  LexicalScoping LVar1;
  int iVar2;
  GenerateFunction *function;
  Function *this_00;
  uint uVar3;
  uint uVar4;
  LocalNameInfo *pLVar5;
  Instruction IVar6;
  uint register_id;
  
  register_id = *data;
  uVar3 = *(uint *)((long)data + 4);
  function = this->current_function_;
  this_00 = function->function_;
  if (term->semantic_ == SemanticOp_Write) {
    if ((term->token_).token_ != 0x115) {
      __assert_fail("term->token_.token_ == Token_Id",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x4c5,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
    }
    if (register_id + 1 == uVar3) {
      LVar1 = term->scoping_;
      if (LVar1 == LexicalScoping_Local) {
        pLVar5 = SearchFunctionLocalName(this,function,(term->token_).field_0.str_);
        if (pLVar5 == (LocalNameInfo *)0x0) {
          __assert_fail("local",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                        ,0x4d0,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)"
                       );
        }
        IVar6.opcode_ =
             (register_id & 0xff) * 0x100 + (pLVar5->register_id_ & 0xffU) * 0x10000 + 0x6000000;
      }
      else if (LVar1 == LexicalScoping_Upvalue) {
        uVar3 = PrepareUpvalue(this,(term->token_).field_0.str_);
        IVar6.opcode_ = (register_id & 0xff) * 0x10000 + (uVar3 & 0xff) * 0x100 + 0x8000000;
      }
      else {
        if (LVar1 != LexicalScoping_Global) {
          return;
        }
        uVar3 = Function::AddConstString(this_00,(term->token_).field_0.str_);
        IVar6.opcode_ = (register_id & 0xff) * 0x10000 + (uVar3 & 0xffff) + 0xa000000;
      }
      Function::AddInstruction(this_00,IVar6,(term->token_).line_);
      return;
    }
    __assert_fail("register_id + 1 == end_register",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                  ,0x4c6,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
  }
  if ((uVar3 - register_id == 0 || (int)uVar3 < (int)register_id) &&
      (uVar3 != 0xffffffff && term->semantic_ == SemanticOp_Read)) {
    return;
  }
  iVar2 = (term->token_).token_;
  switch(iVar2) {
  case 0x112:
switchD_00160261_caseD_112:
    IVar6.opcode_ = (register_id & 0xff) * 0x10000 + (uint)(iVar2 == 0x112) * 0x100 + 0x3000000;
    break;
  case 0x113:
  case 0x114:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
    goto switchD_00160261_caseD_113;
  case 0x115:
    LVar1 = term->scoping_;
    if (LVar1 == LexicalScoping_Local) {
      pLVar5 = SearchFunctionLocalName(this,function,(term->token_).field_0.str_);
      if (pLVar5 == (LocalNameInfo *)0x0) {
        __assert_fail("local",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x4fb,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
      }
      IVar6.opcode_ =
           (register_id & 0xff) * 0x10000 + (pLVar5->register_id_ & 0xffU) * 0x100 + 0x6000000;
    }
    else if (LVar1 == LexicalScoping_Upvalue) {
      uVar4 = PrepareUpvalue(this,(term->token_).field_0.str_);
      IVar6.opcode_ = (register_id & 0xff) * 0x10000 + (uVar4 & 0xff) * 0x100 + 0x7000000;
    }
    else {
      if (LVar1 != LexicalScoping_Global) goto switchD_00160261_caseD_113;
      uVar4 = Function::AddConstString(this_00,(term->token_).field_0.str_);
      IVar6.opcode_ = (register_id & 0xff) * 0x10000 + (uVar4 & 0xffff) + 0x9000000;
    }
    break;
  case 0x116:
    uVar4 = Function::AddConstString(this_00,(term->token_).field_0.str_);
    goto LAB_0016037f;
  case 0x117:
    uVar4 = Function::AddConstNumber(this_00,(term->token_).field_0.number_);
LAB_0016037f:
    IVar6.opcode_ = (register_id & 0xff) * 0x10000 + (uVar4 & 0xffff) + 0x5000000;
    break;
  case 0x11d:
    uVar4 = uVar3 - register_id & 0xffff;
    if (uVar3 == 0xffffffff) {
      uVar4 = 0xffff;
    }
    IVar6.opcode_ = (register_id & 0xff) * 0x10000 + uVar4 + 0xd000000;
    register_id = uVar3;
    goto LAB_0016039a;
  default:
    if (iVar2 == 0x106) goto switchD_00160261_caseD_112;
    if (iVar2 != 0x10c) goto switchD_00160261_caseD_113;
    IVar6.opcode_ = (register_id & 0xff) << 0x10 | 0x1000000;
    register_id = register_id + 1;
    goto LAB_0016039a;
  }
  register_id = register_id + 1;
LAB_0016039a:
  Function::AddInstruction(this_00,IVar6,(term->token_).line_);
switchD_00160261_caseD_113:
  FillRemainRegisterNil(this,register_id,uVar3,(term->token_).line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(Terminator *term, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;
        auto function = GetCurrentFunction();

        // Generate code for SemanticOp_Write
        if (term->semantic_ == SemanticOp_Write)
        {
            assert(term->token_.token_ == Token_Id);
            assert(register_id + 1 == end_register);
            if (term->scoping_ == LexicalScoping_Global)
            {
                auto index = function->AddConstString(term->token_.str_);
                auto instruction = Instruction::ABxCode(OpType_SetGlobal, register_id, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Local)
            {
                auto local = SearchLocalName(term->token_.str_);
                assert(local);
                auto instruction = Instruction::ABCode(OpType_Move, local->register_id_, register_id);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Upvalue)
            {
                auto index = PrepareUpvalue(term->token_.str_);
                auto instruction = Instruction::ABCode(OpType_SetUpvalue, register_id, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            return ;
        }

        // Generate code for SemanticOp_Read
        // Just return when term is SemanticOp_Read and no registers to fill
        if (term->semantic_ == SemanticOp_Read &&
            end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        if (term->token_.token_ == Token_Number || term->token_.token_ == Token_String)
        {
            // Load const to register
            auto index = 0;
            if (term->token_.token_ == Token_Number)
                index = function->AddConstNumber(term->token_.number_);
            else
                index = function->AddConstString(term->token_.str_);
            auto instruction = Instruction::ABxCode(OpType_LoadConst, register_id++, index);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_Id)
        {
            if (term->scoping_ == LexicalScoping_Global)
            {
                // Get value from global table by key index
                auto index = function->AddConstString(term->token_.str_);
                auto instruction = Instruction::ABxCode(OpType_GetGlobal, register_id++, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Local)
            {
                // Load local variable value to dst register
                auto local = SearchLocalName(term->token_.str_);
                assert(local);
                auto instruction = Instruction::ABCode(OpType_Move, register_id++, local->register_id_);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Upvalue)
            {
                // Get upvalue index
                auto index = PrepareUpvalue(term->token_.str_);
                auto instruction = Instruction::ABCode(OpType_GetUpvalue, register_id++, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
        }
        else if (term->token_.token_ == Token_True || term->token_.token_ == Token_False)
        {
            auto bvalue = term->token_.token_ == Token_True ? 1 : 0;
            auto instruction = Instruction::ABCode(OpType_LoadBool, register_id++, bvalue);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_Nil)
        {
            auto instruction = Instruction::ACode(OpType_LoadNil, register_id++);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_VarArg)
        {
            // Copy vararg to registers which start from register_id
            auto expect_results = end_register == EXP_VALUE_COUNT_ANY ?
                EXP_VALUE_COUNT_ANY : end_register - register_id;
            auto instruction = Instruction::AsBxCode(OpType_VarArg, register_id, expect_results);
            function->AddInstruction(instruction, term->token_.line_);

            // All registers will be filled when executing, so do not
            // fill nil to remain registers
            register_id = end_register;
        }

        FillRemainRegisterNil(register_id, end_register, term->token_.line_);
    }